

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O0

int __thiscall procxx::pipe_t::close(pipe_t *this,int __fd)

{
  pipe_end pVar1;
  int iVar2;
  pipe_t *this_local;
  
  pVar1 = read_end();
  close(this,pVar1.end_);
  pVar1 = write_end();
  iVar2 = close(this,pVar1.end_);
  return iVar2;
}

Assistant:

void close() {
    close(read_end());
    close(write_end());
  }